

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DescriptorPool.cpp
# Opt level: O0

Ptr<DescriptorPool>
myvk::DescriptorPool::Create
          (Ptr<Device> *device,uint32_t max_sets,
          vector<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_> *sizes)

{
  size_type sVar1;
  vector<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_> *in_RCX;
  undefined4 in_EDX;
  element_type *in_RDI;
  Ptr<DescriptorPool> PVar2;
  VkDescriptorPoolCreateInfo *unaff_retaddr;
  Ptr<Device> *in_stack_00000008;
  VkDescriptorPoolCreateInfo create_info;
  undefined4 local_48 [4];
  undefined4 local_38;
  undefined4 local_34;
  undefined4 local_30;
  VkDescriptorPoolSize *local_28;
  vector<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_> *local_20;
  undefined4 local_14;
  
  local_20 = in_RCX;
  local_14 = in_EDX;
  memset(local_48,0,0x28);
  local_48[0] = 0x21;
  local_38 = 1;
  local_34 = local_14;
  sVar1 = std::vector<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_>::size(local_20);
  local_30 = (undefined4)sVar1;
  local_28 = std::vector<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_>::data
                       ((vector<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_> *)
                        0x2e47a4);
  PVar2 = Create(in_stack_00000008,unaff_retaddr);
  PVar2.super___shared_ptr<myvk::DescriptorPool,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (Ptr<DescriptorPool>)
         PVar2.super___shared_ptr<myvk::DescriptorPool,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Ptr<DescriptorPool> DescriptorPool::Create(const Ptr<Device> &device, uint32_t max_sets,
                                                       const std::vector<VkDescriptorPoolSize> &sizes) {
	VkDescriptorPoolCreateInfo create_info = {};
	create_info.sType = VK_STRUCTURE_TYPE_DESCRIPTOR_POOL_CREATE_INFO;
	create_info.flags = VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT;
	create_info.maxSets = max_sets;
	create_info.poolSizeCount = sizes.size();
	create_info.pPoolSizes = sizes.data();

	return Create(device, create_info);
}